

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

void * get_FMfieldAddr_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  int index;
  int local_24;
  void *local_8;
  
  local_24 = 0;
  while ((*(long *)(in_RDI + (long)local_24 * 0x18) != 0 &&
         (iVar1 = strcmp(*(char **)(in_RDI + (long)local_24 * 0x18),in_RSI), iVar1 != 0))) {
    local_24 = local_24 + 1;
  }
  if (*(long *)(in_RDI + (long)local_24 * 0x18) == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)(in_RDX + *(int *)(in_RDI + (long)local_24 * 0x18 + 0x14));
  }
  return local_8;
}

Assistant:

extern void *
get_FMfieldAddr_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return NULL;

    return ((char*)data) + field_list[index].field_offset;
}